

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_sa_system.hpp
# Opt level: O2

void __thiscall
openjij::system::
SASystem<openjij::graph::BinaryPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>_>
::Flip(SASystem<openjij::graph::BinaryPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>_>
       *this,int32_t index)

{
  double dVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  *pvVar6;
  pointer pvVar7;
  pointer puVar8;
  pointer piVar9;
  unsigned_long uVar10;
  pointer ppVar11;
  int *piVar12;
  pointer pdVar13;
  const_iterator __begin4;
  pointer puVar14;
  int *v_index;
  int *piVar15;
  
  pcVar5 = (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar2 = pcVar5[index];
  pcVar5[index] = '\x01' - cVar2;
  pvVar6 = this->key_value_list_;
  pvVar7 = (this->adjacency_list_->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar14 = pvVar7[index].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar8 = *(pointer *)
            ((long)&pvVar7[index].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + 8);
  piVar9 = (this->zero_count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (cVar2 == '\0') {
    for (; puVar14 != puVar8; puVar14 = puVar14 + 1) {
      uVar10 = *puVar14;
      ppVar11 = (pvVar6->
                super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      dVar1 = ppVar11[uVar10].second;
      iVar3 = piVar9[uVar10];
      piVar9[uVar10] = iVar3 + -1;
      piVar12 = *(pointer *)
                 ((long)&ppVar11[uVar10].first.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 + 8);
      pcVar5 = (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar13 = (this->base_energy_difference_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (piVar15 = *(int **)&ppVar11[uVar10].first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl; piVar15 != piVar12; piVar15 = piVar15 + 1) {
        iVar4 = *piVar15;
        if ((iVar4 != index) && (pcVar5[iVar4] + iVar3 == 2)) {
          pdVar13[iVar4] = pdVar13[iVar4] + dVar1;
        }
      }
    }
  }
  else {
    for (; puVar14 != puVar8; puVar14 = puVar14 + 1) {
      uVar10 = *puVar14;
      ppVar11 = (pvVar6->
                super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      dVar1 = ppVar11[uVar10].second;
      iVar3 = piVar9[uVar10];
      piVar9[uVar10] = iVar3 + 1;
      piVar12 = *(pointer *)
                 ((long)&ppVar11[uVar10].first.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 + 8);
      pcVar5 = (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar13 = (this->base_energy_difference_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (piVar15 = *(int **)&ppVar11[uVar10].first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl; piVar15 != piVar12; piVar15 = piVar15 + 1) {
        iVar4 = *piVar15;
        if ((iVar4 != index) && (pcVar5[iVar4] + iVar3 == 1)) {
          pdVar13[iVar4] = pdVar13[iVar4] - dVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void Flip(const std::int32_t index) {
      const VariableType state = sample_[index];
      sample_[index] = 1 - sample_[index];
      if (state == 0) {
         for (const auto &index_key: adjacency_list_[index]) {
            const ValueType val = key_value_list_[index_key].second;
            const std::int32_t total_zero_count = zero_count_[index_key];
            zero_count_[index_key] -= 1;
            for (const auto &v_index: key_value_list_[index_key].first) {
               if (total_zero_count + sample_[v_index] == 2 && v_index != index) {
                  base_energy_difference_[v_index] += val;
               }
            }
         }
      }
      else { //state == 1
         for (const auto &index_key: adjacency_list_[index]) {
            const ValueType val = key_value_list_[index_key].second;
            const std::int32_t total_zero_count = zero_count_[index_key];
            zero_count_[index_key] += 1;
            for (const auto &v_index: key_value_list_[index_key].first) {
               if (total_zero_count + sample_[v_index] == 1 && v_index != index) {
                  base_energy_difference_[v_index] -= val;
               }
            }
         }
      }
   }